

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

HasbitMode google::protobuf::internal::cpp::GetFieldHasbitMode(FieldDescriptor *field)

{
  bool bVar1;
  byte extraout_AL;
  byte bVar2;
  Nonnull<const_char_*> pcVar3;
  undefined1 v1;
  OneofDescriptor *pOVar4;
  FieldDescriptor *pFVar5;
  cpp acStack_18 [16];
  
  if ((field->field_0x3 & 1) == 0) {
LAB_0016df7a:
    if (((field->options_->field_0)._impl_.weak_ != false) || ((field->field_0x1 & 8) != 0)) {
      return kNoHasbit;
    }
    bVar1 = FieldDescriptor::has_presence(field);
    if (bVar1) {
      return kTrueHasbit;
    }
    bVar2 = field->field_0x1;
    v1 = (bVar2 & 0x20) >> 5;
    if (0xbf < bVar2 == (bool)v1) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
      goto LAB_0016dfb3;
    }
  }
  else {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar4 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar4 = (field->scope_).containing_oneof;
      if (pOVar4 == (OneofDescriptor *)0x0) {
        protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if (pOVar4 == (OneofDescriptor *)0x0) {
      protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb63);
    }
    if ((pOVar4->field_count_ != 1) || (pFVar5 = pOVar4->fields_, (pFVar5->field_0x1 & 2) == 0)) {
      if ((field->field_0x3 & 1) != 0) {
        return kNoHasbit;
      }
      goto LAB_0016df7a;
    }
    GetFieldHasbitMode(acStack_18);
    v1 = SUB81(pFVar5,0);
    bVar2 = extraout_AL;
  }
  pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                     ((bool)v1,0xbf < bVar2,
                      "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
LAB_0016dfb3:
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    GetFieldHasbitMode();
  }
  return (byte)~field->field_0x1 >> 4 & kHintHasbit;
}

Assistant:

HasbitMode GetFieldHasbitMode(const FieldDescriptor* field) {
  // Do not generate hasbits for "real-oneof", weak, or extension fields.
  if (field->real_containing_oneof() || field->options().weak() ||
      field->is_extension()) {
    return HasbitMode::kNoHasbit;
  }

  // Explicit-presence fields always have true hasbits.
  if (field->has_presence()) {
    return HasbitMode::kTrueHasbit;
  }

  // Implicit presence fields.
  if (!field->is_repeated()) {
    return HasbitMode::kHintHasbit;
  }
  // We currently don't implement hasbits for implicit repeated fields.
  return HasbitMode::kNoHasbit;
}